

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderWriter.h
# Opt level: O0

ssize_t __thiscall
aeron::concurrent::logbuffer::HeaderWriter::write
          (HeaderWriter *this,int __fd,void *__buf,size_t __n)

{
  uint8_t *puVar1;
  int offset;
  undefined4 in_register_00000034;
  undefined4 in_R8D;
  DataFrameHeaderDefn *hdr;
  int32_t termId_local;
  index_t length_local;
  index_t offset_local;
  AtomicBuffer *termBuffer_local;
  HeaderWriter *this_local;
  
  offset = (int)__buf;
  AtomicBuffer::putInt32Ordered
            ((AtomicBuffer *)CONCAT44(in_register_00000034,__fd),offset,-(int)__n);
  atomic::release();
  puVar1 = AtomicBuffer::buffer((AtomicBuffer *)CONCAT44(in_register_00000034,__fd));
  puVar1 = puVar1 + offset;
  puVar1[4] = '\0';
  puVar1[5] = 0xc0;
  puVar1[6] = '\x01';
  puVar1[7] = '\0';
  *(int *)(puVar1 + 8) = offset;
  *(int32_t *)(puVar1 + 0xc) = this->m_sessionId;
  *(int32_t *)(puVar1 + 0x10) = this->m_streamId;
  *(undefined4 *)(puVar1 + 0x14) = in_R8D;
  return (ssize_t)puVar1;
}

Assistant:

inline void write(AtomicBuffer& termBuffer, util::index_t offset, util::index_t length, std::int32_t termId) const
    {
        termBuffer.putInt32Ordered(offset, -length);
        atomic::release();

        struct DataFrameHeader::DataFrameHeaderDefn* hdr =
            (struct DataFrameHeader::DataFrameHeaderDefn *)(termBuffer.buffer() + offset);

        hdr->version = DataFrameHeader::CURRENT_VERSION;
        hdr->flags = FrameDescriptor::BEGIN_FRAG | FrameDescriptor::END_FRAG;
        hdr->type = DataFrameHeader::HDR_TYPE_DATA;
        hdr->termOffset = offset;
        hdr->sessionId = m_sessionId;
        hdr->streamId = m_streamId;
        hdr->termId = termId;
    }